

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

int __thiscall cmCTest::ReadCustomConfigurationFileTree(cmCTest *this,string *dir,cmMakefile *mf)

{
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  _Rb_tree_node_base *p_Var6;
  pointer filename;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  Glob gl;
  string fname;
  string rexpr;
  ostringstream cmCTestLog_msg;
  long *local_268;
  long local_258 [2];
  cmMakefile *local_248;
  undefined1 local_240 [16];
  GlobInternals local_230;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  undefined8 local_190;
  char *local_188;
  undefined8 local_180;
  ios_base local_138 [264];
  
  local_248 = mf;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"* Read custom CTest configuration directory: ",0x2d);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(dir->_M_dataplus)._M_p,dir->_M_string_length);
  std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx",
      0xc15,(char *)local_240._0_8_,false);
  if ((GlobInternals *)local_240._0_8_ != &local_230) {
    operator_delete((void *)local_240._0_8_,
                    (ulong)((long)local_230.Files.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  local_1a8._8_8_ = (dir->_M_dataplus)._M_p;
  local_1a8._0_8_ = dir->_M_string_length;
  local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_190 = 0x12;
  local_188 = "/CTestCustom.cmake";
  local_180 = 0;
  views._M_len = 2;
  views._M_array = (iterator)local_1a8;
  cmCatViews(&local_1e8,views);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"* Check for file: ",0x12)
  ;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx",
      0xc18,(char *)local_240._0_8_,false);
  if ((GlobInternals *)local_240._0_8_ != &local_230) {
    operator_delete((void *)local_240._0_8_,
                    (ulong)((long)local_230.Files.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  bVar2 = cmsys::SystemTools::FileExists(&local_1e8);
  if (!bVar2) {
    bVar2 = false;
    goto LAB_001bce98;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"* Read custom CTest configuration file: ",0x28);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx",
      0xc1c,(char *)local_240._0_8_,false);
  if ((GlobInternals *)local_240._0_8_ != &local_230) {
    operator_delete((void *)local_240._0_8_,
                    (ulong)((long)local_230.Files.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  bVar3 = true;
  if ((cmSystemTools::s_ErrorOccurred == false) && (cmSystemTools::s_FatalErrorOccurred == false)) {
    bVar3 = cmSystemTools::GetInterruptFlag();
  }
  cmSystemTools::s_FatalErrorOccurred = false;
  cmSystemTools::s_ErrorOccurred = false;
  bVar2 = cmMakefile::ReadListFile(local_248,&local_1e8);
  if (((bVar2) && (cmSystemTools::s_ErrorOccurred == false)) &&
     (cmSystemTools::s_FatalErrorOccurred == false)) {
    bVar2 = cmSystemTools::GetInterruptFlag();
    if (bVar2) goto LAB_001bcdae;
  }
  else {
LAB_001bcdae:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Problem reading custom configuration: ",0x26);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,7,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0xc23,(char *)local_240._0_8_,false);
    if ((GlobInternals *)local_240._0_8_ != &local_230) {
      operator_delete((void *)local_240._0_8_,
                      (ulong)((long)local_230.Files.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  bVar2 = true;
  if (bVar3 != false) {
    cmSystemTools::s_ErrorOccurred = true;
  }
LAB_001bce98:
  local_1a8._8_8_ = (dir->_M_dataplus)._M_p;
  local_1a8._0_8_ = dir->_M_string_length;
  local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_190 = 0x12;
  local_188 = "/CTestCustom.ctest";
  local_180 = 0;
  views_00._M_len = 2;
  views_00._M_array = (iterator)local_1a8;
  cmCatViews(&local_1c8,views_00);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"* Check for file: ",0x12)
  ;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx",
      0xc2c,(char *)local_240._0_8_,false);
  if ((GlobInternals *)local_240._0_8_ != &local_230) {
    operator_delete((void *)local_240._0_8_,
                    (ulong)((long)local_230.Files.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if (!bVar2) {
    bVar3 = cmsys::SystemTools::FileExists(&local_1c8);
    if (bVar3) {
      cmsys::Glob::Glob((Glob *)local_240);
      local_240[8] = true;
      cmsys::Glob::FindFiles((Glob *)local_240,&local_1c8,(GlobMessages *)0x0);
      pvVar5 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_240);
      filename = (pvVar5->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = (pvVar5->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (filename != pbVar1) {
        do {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"* Read custom CTest configuration file: ",0x28);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(filename->_M_dataplus)._M_p,
                              filename->_M_string_length);
          std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          std::__cxx11::stringbuf::str();
          Log(this,0,
              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
              ,0xc35,(char *)local_268,false);
          if (local_268 != local_258) {
            operator_delete(local_268,local_258[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          bVar2 = cmMakefile::ReadListFile(local_248,filename);
          if (((bVar2) && (cmSystemTools::s_ErrorOccurred == false)) &&
             (cmSystemTools::s_FatalErrorOccurred == false)) {
            bVar2 = cmSystemTools::GetInterruptFlag();
            if (bVar2) goto LAB_001bd111;
          }
          else {
LAB_001bd111:
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Problem reading custom configuration: ",0x26);
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,(filename->_M_dataplus)._M_p,
                                filename->_M_string_length);
            std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
            std::ostream::put((char)poVar4);
            std::ostream::flush();
            std::__cxx11::stringbuf::str();
            Log(this,7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
                ,0xc39,(char *)local_268,false);
            if (local_268 != local_258) {
              operator_delete(local_268,local_258[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
          }
          filename = filename + 1;
        } while (filename != pbVar1);
      }
      cmsys::Glob::~Glob((Glob *)local_240);
      bVar2 = true;
    }
  }
  if (bVar2) {
    Private::GetNamedTestingHandlers_abi_cxx11_
              ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
                *)local_240,
               (this->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl);
    if ((_Rb_tree_node_base *)
        local_230.Files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != (_Rb_tree_node_base *)(local_240 + 8)) {
      p_Var6 = (_Rb_tree_node_base *)
               local_230.Files.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"* Read custom CTest configuration vectors for handler: ",
                   0x37);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,*(char **)(p_Var6 + 1),(long)p_Var6[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," (",2);
        poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
        std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(this,0,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
            ,0xc44,(char *)local_268,false);
        if (local_268 != local_258) {
          operator_delete(local_268,local_258[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        (**(code **)**(undefined8 **)(p_Var6 + 2))(*(undefined8 **)(p_Var6 + 2),local_248);
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
      } while (p_Var6 != (_Rb_tree_node_base *)(local_240 + 8));
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
                 *)local_240);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  return 1;
}

Assistant:

int cmCTest::ReadCustomConfigurationFileTree(const std::string& dir,
                                             cmMakefile* mf)
{
  bool found = false;
  cmCTestLog(this, DEBUG,
             "* Read custom CTest configuration directory: " << dir
                                                             << std::endl);

  std::string fname = cmStrCat(dir, "/CTestCustom.cmake");
  cmCTestLog(this, DEBUG, "* Check for file: " << fname << std::endl);
  if (cmSystemTools::FileExists(fname)) {
    cmCTestLog(this, DEBUG,
               "* Read custom CTest configuration file: " << fname
                                                          << std::endl);
    bool erroroc = cmSystemTools::GetErrorOccurredFlag();
    cmSystemTools::ResetErrorOccurredFlag();

    if (!mf->ReadListFile(fname) || cmSystemTools::GetErrorOccurredFlag()) {
      cmCTestLog(this, ERROR_MESSAGE,
                 "Problem reading custom configuration: " << fname
                                                          << std::endl);
    }
    found = true;
    if (erroroc) {
      cmSystemTools::SetErrorOccurred();
    }
  }

  std::string rexpr = cmStrCat(dir, "/CTestCustom.ctest");
  cmCTestLog(this, DEBUG, "* Check for file: " << rexpr << std::endl);
  if (!found && cmSystemTools::FileExists(rexpr)) {
    cmsys::Glob gl;
    gl.RecurseOn();
    gl.FindFiles(rexpr);
    std::vector<std::string>& files = gl.GetFiles();
    for (const std::string& file : files) {
      cmCTestLog(this, DEBUG,
                 "* Read custom CTest configuration file: " << file
                                                            << std::endl);
      if (!mf->ReadListFile(file) || cmSystemTools::GetErrorOccurredFlag()) {
        cmCTestLog(this, ERROR_MESSAGE,
                   "Problem reading custom configuration: " << file
                                                            << std::endl);
      }
    }
    found = true;
  }

  if (found) {
    for (auto& handler : this->Impl->GetNamedTestingHandlers()) {
      cmCTestLog(this, DEBUG,
                 "* Read custom CTest configuration vectors for handler: "
                   << handler.first << " (" << handler.second << ")"
                   << std::endl);
      handler.second->PopulateCustomVectors(mf);
    }
  }

  return 1;
}